

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

ON_BoundingBox * __thiscall
ON_OutlineFigure::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_OutlineFigure *this)

{
  ON_OutlineFigurePoint *pOVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  ON_2fPoint OVar5;
  ON_2fPoint *pOVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  ON__UINT32 OVar13;
  uint uVar14;
  uint uVar15;
  float *pfVar16;
  ON__UINT32 OVar17;
  long lVar18;
  ON__UINT32 j;
  ulong uVar19;
  uint uVar20;
  ON__UINT32 OVar21;
  ON_2fPoint bbox_cv_max;
  ON_2fPoint bbox_cv_min;
  ON_OutlineFigurePoint cv [4];
  ON_BoundingBox bez_bbox;
  ON_BezierCurve bez;
  ON_2fPoint local_f8;
  ON_2fPoint local_f0;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  ON_OutlineFigurePoint *local_d8;
  ON__UINT32 local_cc;
  undefined1 local_c8 [8];
  float local_c0;
  undefined4 local_bc;
  float fStack_b8;
  float local_b4;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a4;
  float local_9c;
  ON_BoundingBox *local_90;
  ON_OutlineFigure *local_88;
  ON_BoundingBox local_80;
  ON_BezierCurve local_50;
  
  if (this->m_bbox_status == '\0') {
    this->m_bbox_status = '\a';
    OVar21 = 0;
    OVar13 = Internal_FigureEndDex(this,false);
    if (OVar13 != 0) {
      local_d8 = (this->m_points).m_a;
      local_e4 = (local_d8->m_point).x;
      local_e8 = (local_d8->m_point).y;
      local_f8 = local_d8->m_point;
      local_f0 = local_f8;
      local_e0 = local_e8;
      local_dc = local_e4;
      do {
        uVar14 = Internal_SegmentDegree(this,OVar21);
        OVar17 = OVar21;
        if (0xfffffffc < uVar14 - 4) {
          fVar2 = local_d8[uVar14 + OVar21].m_point.x;
          fVar3 = fVar2;
          if ((local_dc <= fVar2) && (fVar3 = local_dc, local_e4 < fVar2)) {
            local_e4 = fVar2;
          }
          local_dc = fVar3;
          fVar2 = local_d8[uVar14 + OVar21].m_point.y;
          fVar3 = fVar2;
          if ((local_e0 <= fVar2) && (fVar3 = local_e0, local_e8 < fVar2)) {
            local_e8 = fVar2;
          }
          local_e0 = fVar3;
          if (1 < uVar14) {
            OVar17 = OVar21 + 1;
            fVar2 = local_d8[OVar17].m_point.x;
            fVar3 = local_d8[OVar17].m_point.y;
            if (local_f0.x <= fVar2) {
              if (local_f8.x < fVar2) {
                local_f8.x = fVar2;
              }
            }
            else {
              local_f0.x = fVar2;
            }
            pfVar16 = &local_f0.y;
            if ((fVar3 < local_f0.y) || (pfVar16 = &local_f8.y, local_f8.y < fVar3)) {
              *pfVar16 = fVar3;
            }
            if (uVar14 == 3) {
              OVar17 = OVar21 + 2;
              fVar2 = local_d8[OVar17].m_point.x;
              fVar3 = local_d8[OVar17].m_point.y;
              if (local_f0.x <= fVar2) {
                if (local_f8.x < fVar2) {
                  local_f8.x = fVar2;
                }
              }
              else {
                local_f0.x = fVar2;
              }
              pfVar16 = &local_f0.y;
              if ((fVar3 < local_f0.y) || (pfVar16 = &local_f8.y, local_f8.y < fVar3)) {
                *pfVar16 = fVar3;
              }
            }
          }
        }
        OVar21 = OVar17 + 1;
      } while (OVar21 < OVar13);
      if ((((local_f0.x < local_dc) || (local_e4 < local_f8.x)) || (local_f0.y < local_e0)) ||
         (local_e8 < local_f8.y)) {
        lVar18 = 4;
        local_90 = __return_storage_ptr__;
        do {
          *(undefined4 *)((long)&local_cc + lVar18) = 0;
          *(ON_2fPoint *)(local_c8 + lVar18) = ON_2fPoint::NanPoint;
          lVar18 = lVar18 + 0xc;
        } while (lVar18 != 0x34);
        local_9c = (local_d8->m_point).y;
        local_a4._0_1_ = local_d8->m_point_type;
        local_a4._1_1_ = local_d8->m_point_proximity;
        local_a4._2_2_ = local_d8->m_figure_index;
        local_a4._4_4_ = (local_d8->m_point).x;
        uVar19 = 0;
        local_cc = OVar13;
        local_88 = this;
        do {
          OVar21 = (ON__UINT32)uVar19;
          uVar14 = Internal_SegmentDegree(this,OVar21);
          OVar13 = local_cc;
          if ((uVar14 & 0xfffffffe) == 2) {
            local_c0 = local_d8[uVar19].m_point.y;
            local_c8 = local_d8[uVar19].m_point_type;
            uVar20 = OVar21 + 1;
            local_b4 = local_d8[uVar20].m_point.y;
            pOVar1 = local_d8 + uVar20;
            uVar4._0_1_ = pOVar1->m_point_type;
            uVar4._1_1_ = pOVar1->m_point_proximity;
            uVar4._2_2_ = pOVar1->m_figure_index;
            uVar4._4_4_ = (pOVar1->m_point).x;
            local_bc = (undefined4)uVar4;
            OVar5.y = local_b4;
            OVar5.x = (float)uVar4._4_4_;
            uVar15 = OVar21 + 2;
            local_a8 = local_d8[uVar15].m_point.y;
            pOVar1 = local_d8 + uVar15;
            local_b0._0_1_ = pOVar1->m_point_type;
            local_b0._1_1_ = pOVar1->m_point_proximity;
            local_b0._2_2_ = pOVar1->m_figure_index;
            local_b0._4_4_ = (pOVar1->m_point).x;
            local_f8 = OVar5;
            local_f0 = OVar5;
            if (uVar14 == 3) {
              if ((float)uVar4._4_4_ <= (float)local_b0._4_4_) {
                if ((float)uVar4._4_4_ < (float)local_b0._4_4_) {
                  local_f8.y = local_b4;
                  local_f8.x = (float)local_b0._4_4_;
                }
              }
              else {
                local_f0.y = local_b4;
                local_f0.x = (float)local_b0._4_4_;
              }
              pOVar6 = &local_f0;
              if (local_a8 < local_f0.y) {
LAB_00492f12:
                pOVar6->y = local_a8;
              }
              else {
                pOVar6 = &local_f8;
                if (local_f8.y < local_a8) goto LAB_00492f12;
              }
              local_9c = local_d8[OVar21 + 3].m_point.y;
              pOVar1 = local_d8 + (OVar21 + 3);
              local_a4._0_1_ = pOVar1->m_point_type;
              local_a4._1_1_ = pOVar1->m_point_proximity;
              local_a4._2_2_ = pOVar1->m_figure_index;
              local_a4._4_4_ = (pOVar1->m_point).x;
              uVar20 = uVar15;
            }
            OVar21 = uVar20;
            fStack_b8 = (float)uVar4._4_4_;
            if (((local_f0.x < local_dc) || (local_e4 < local_f8.x)) ||
               ((local_f0.y < local_e0 || (local_e8 < local_f8.y)))) {
              ON_BezierCurve::ON_BezierCurve(&local_50,3,false,uVar14 + 1);
              pfVar16 = &local_c0;
              uVar19 = 0;
              do {
                ON_3dPoint::ON_3dPoint(&local_80.m_min,(double)pfVar16[-1],(double)*pfVar16,0.0);
                ON_BezierCurve::SetCV(&local_50,(int)uVar19,&local_80.m_min);
                uVar19 = uVar19 + 1;
                pfVar16 = pfVar16 + 3;
              } while (uVar14 + 1 != uVar19);
              ON_BezierCurve::BoundingBox(&local_80,&local_50);
              bVar12 = ON_BoundingBox::IsNotEmpty(&local_80);
              this = local_88;
              OVar13 = local_cc;
              if (((bVar12) && (-1.2343210235867887e+38 < local_80.m_min.x)) &&
                 ((local_80.m_max.x < 1.2343210235867887e+38 &&
                  ((-1.2343210235867887e+38 < local_80.m_min.y &&
                   (local_80.m_max.y < 1.2343210235867887e+38)))))) {
                ON_2fPoint::Set(&local_f0,(float)local_80.m_min.x,(float)local_80.m_min.y);
                ON_2fPoint::Set(&local_f8,(float)local_80.m_max.x,(float)local_80.m_max.y);
              }
              ON_BezierCurve::~ON_BezierCurve(&local_50);
            }
          }
          uVar19 = (ulong)(OVar21 + 1);
        } while (OVar21 + 1 < OVar13);
        (this->m_bbox_min).x = local_dc;
        (this->m_bbox_min).y = local_e0;
        (this->m_bbox_max).x = local_e4;
        (this->m_bbox_max).y = local_e8;
        this->m_bbox_status = '\x01';
        bVar12 = ON_2fPoint::operator==(&this->m_bbox_min,&this->m_bbox_max);
        __return_storage_ptr__ = local_90;
        if (((bVar12) && (this->m_figure_type < 5)) &&
           ((0x13U >> (this->m_figure_type & 0x1f) & 1) != 0)) {
          this->m_figure_type = NotPerimeter;
        }
      }
      else {
        (this->m_bbox_min).x = local_dc;
        (this->m_bbox_min).y = local_e0;
        (this->m_bbox_max).x = local_e4;
        (this->m_bbox_max).y = local_e8;
        this->m_bbox_status = '\x01';
      }
    }
  }
  dVar11 = ON_BoundingBox::NanBoundingBox.m_max.z;
  dVar10 = ON_BoundingBox::NanBoundingBox.m_max.x;
  dVar9 = ON_BoundingBox::NanBoundingBox.m_min.z;
  dVar8 = ON_BoundingBox::NanBoundingBox.m_min.y;
  dVar7 = ON_BoundingBox::NanBoundingBox.m_min.x;
  if (this->m_bbox_status == '\x01') {
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_c8,&this->m_bbox_min);
    ON_3dPoint::ON_3dPoint(&local_80.m_min,&this->m_bbox_max);
    ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__,(ON_3dPoint *)local_c8,&local_80.m_min);
  }
  else {
    (__return_storage_ptr__->m_max).y = ON_BoundingBox::NanBoundingBox.m_max.y;
    (__return_storage_ptr__->m_max).z = dVar11;
    (__return_storage_ptr__->m_min).z = dVar9;
    (__return_storage_ptr__->m_max).x = dVar10;
    (__return_storage_ptr__->m_min).x = dVar7;
    (__return_storage_ptr__->m_min).y = dVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_OutlineFigure::BoundingBox() const
{
  while (0 == m_bbox_status)
  {
    m_bbox_status = 7;

    const ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
    if (0 == figure_end_dex)
      break;

    const ON_OutlineFigurePoint* a = m_points.Array();
    ON_2fPoint bbox_min = a[0].m_point;
    ON_2fPoint bbox_max = bbox_min;
    ON_2fPoint bbox_cv_min = bbox_min;
    ON_2fPoint bbox_cv_max = bbox_max;
    
    for (ON__UINT32 i = 0U; i < figure_end_dex; ++i)
    {
      const ON__UINT32 degree = ON_OutlineFigure::Internal_SegmentDegree(i);
      if (degree < 1U || degree > 3U)
        continue;
      // a[i] = start of bezier (line,quadratic,or cubic)
      ON_OutlineFigurePoint p = a[i+degree]; // p = a[i+degree] = end of bezier (line,quadratic,or cubic)
      Internal_GrowBBox(p.m_point, p.m_point, bbox_min, bbox_max);
      if (degree >= 2U)
      {
        p = a[++i]; // p = 1st interior cv of a quadratic or cubic bezier
        Internal_GrowBBox(p.m_point, p.m_point, bbox_cv_min, bbox_cv_max);
        if (3U == degree)
        {
          p = a[++i]; // p = 2nd interior cv of a cubic bezier
          Internal_GrowBBox(p.m_point, p.m_point, bbox_cv_min, bbox_cv_max);
        }
      }
    }

    if (
      bbox_cv_min.x >= bbox_min.x 
      && bbox_cv_max.x <= bbox_max.x
      && bbox_cv_min.y >= bbox_min.y 
      && bbox_cv_max.y <= bbox_max.y
      )
    {
      // If there were any bezier segments, their control points were inside the bounding box of the segment end points.
      m_bbox_min = bbox_min;
      m_bbox_max = bbox_max;
      m_bbox_status = 1;
      break;
    }

    // get bezeir bounding boxes as needed
    ON_OutlineFigurePoint cv[4];
    cv[3] = a[0]; // to suppress potintial uninitialized memory warning

    for (ON__UINT32 i = 0U; i < figure_end_dex; ++i)
    {
      const ON__UINT32 degree = ON_OutlineFigure::Internal_SegmentDegree(i);
      if (degree < 2U || degree > 3U)
        continue; // correct to continue when degree = 1
      cv[0] = a[i]; // [a[i] = start of quadratic or cubic bezier
      cv[1] = a[++i]; // 1st interior cv of a  quadratic or cubic bezer
      bbox_cv_min = cv[1].m_point;
      bbox_cv_max = bbox_cv_min;
      cv[2] = a[i + 1]; // end of quadratic bezier or penultimate cv of a cubic bezier
      if (3U == degree)
      {
        Internal_GrowBBox(cv[2].m_point, cv[2].m_point, bbox_cv_min, bbox_cv_max);
        ++i;
        cv[3] = a[i + 1]; // end of a cubic bezier
      }

      if (
        bbox_cv_min.x >= bbox_min.x 
        && bbox_cv_max.x <= bbox_max.x
        && bbox_cv_min.y >= bbox_min.y 
        && bbox_cv_max.y <= bbox_max.y
        )
      {
        // the control points of this bezier are inside the current bounding box.
        continue;
      }

      // get tight bounding box of this bezier
      ON_BezierCurve bez(3, false, degree + 1);
      for (ON__UINT32 j = 0; j <= degree; j++)
        bez.SetCV(j, ON_3dPoint(cv[j].m_point.x, cv[j].m_point.y, 0.0));

      const ON_BoundingBox bez_bbox = bez.BoundingBox();
      if (bez_bbox.IsNotEmpty())
      {
        const double minf = ON_UNSET_FLOAT;
        const double maxf = ON_UNSET_POSITIVE_FLOAT;
        if (
          minf < bez_bbox.m_min.x 
          && bez_bbox.m_max.x < maxf
          && minf < bez_bbox.m_min.y 
          && bez_bbox.m_max.y < maxf
          )
        {
          bbox_cv_min.Set((float)bez_bbox.m_min.x, (float)bez_bbox.m_min.y);
          bbox_cv_max.Set((float)bez_bbox.m_max.x, (float)bez_bbox.m_max.y);
        }
      }

      Internal_GrowBBox(bbox_cv_min, bbox_cv_max, bbox_cv_min, bbox_cv_max);
    }

    m_bbox_min = bbox_min;
    m_bbox_max = bbox_max;
    m_bbox_status = 1;
    if (m_bbox_min == m_bbox_max)
    {
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
    }
    break;
  }

  if (1 == m_bbox_status)
    return ON_BoundingBox(ON_3dPoint(m_bbox_min), ON_3dPoint(m_bbox_max));

  return ON_BoundingBox::NanBoundingBox;
}